

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rest-simpleweb.hh
# Opt level: O2

void __thiscall
discordpp::RestSimpleWeb<discordpp::Bot>::doCall
          (RestSimpleWeb<discordpp::Bot> *this,sptr<RenderedCall> *call)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__y;
  string *method;
  element_type *peVar1;
  io_context *this_00;
  __shared_ptr<discordpp::BotStruct::RenderedCall,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  ostream *poVar3;
  element_type *peVar4;
  long lVar5;
  string_view content;
  __string_type target;
  CaseInsensitiveMultimap headers;
  ostringstream targetss;
  allocator<char> local_311;
  __shared_ptr<discordpp::BotStruct::RenderedCall,_(__gnu_cxx::_Lock_policy)2> *local_310;
  ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>
  *local_308;
  char *local_300;
  size_t local_2f8;
  string local_2e0;
  function<void_(std::shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Response>,_const_std::error_code_&)>
  local_2c0;
  undefined1 local_2a0 [24];
  string local_288 [40];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_260;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_220;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_SimpleWeb::CaseInsensitiveEqual,_SimpleWeb::CaseInsensitiveHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
  local_1e0;
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  poVar3 = std::operator<<((ostream *)local_1a8,"/api/v");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,(string *)
                         (((call->
                           super___shared_ptr<discordpp::BotStruct::RenderedCall,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr)->target).
                         super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr);
  local_310 = &call->
               super___shared_ptr<discordpp::BotStruct::RenderedCall,_(__gnu_cxx::_Lock_policy)2>;
  std::__cxx11::stringbuf::str();
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[14],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_2a0,(char (*) [14])"authorization",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (&(this->super_Bot).field_0x90 + (long)(this->super_Bot)._vptr_Bot[-3]));
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[22],_const_char_(&)[12],_true>
            (&local_260,(char (*) [22])"X-RateLimit-Precision",(char (*) [12])"millisecond");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[11],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
            (&local_220,(char (*) [11])"User-Agent",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (&(this->super_Bot).field_0xb8 + (long)(this->super_Bot)._vptr_Bot[-3]));
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,SimpleWeb::CaseInsensitiveEqual,SimpleWeb::CaseInsensitiveHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
  ::_Hashtable<std::pair<std::__cxx11::string_const,std::__cxx11::string>const*>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,SimpleWeb::CaseInsensitiveEqual,SimpleWeb::CaseInsensitiveHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
              *)&local_1e0,local_2a0,&local_1e0,0,&local_300,&local_2c0,&local_311);
  p_Var2 = local_310;
  lVar5 = 0x80;
  do {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(local_2a0 + lVar5));
    lVar5 = lVar5 + -0x40;
  } while (lVar5 != -0x40);
  peVar4 = ((__shared_ptr<discordpp::BotStruct::RenderedCall,_(__gnu_cxx::_Lock_policy)2> *)
           &p_Var2->_M_ptr)->_M_ptr;
  __y = (peVar4->type).
        super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr;
  if (__y != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[13],_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_2a0,(char (*) [13])"Content-Type",__y);
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,SimpleWeb::CaseInsensitiveEqual,SimpleWeb::CaseInsensitiveHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
    ::_M_emplace<std::pair<std::__cxx11::string_const,std::__cxx11::string>>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,SimpleWeb::CaseInsensitiveEqual,SimpleWeb::CaseInsensitiveHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
                *)&local_1e0,local_2a0);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_2a0);
    peVar4 = ((__shared_ptr<discordpp::BotStruct::RenderedCall,_(__gnu_cxx::_Lock_policy)2> *)
             &p_Var2->_M_ptr)->_M_ptr;
  }
  local_308 = *(ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>
                **)&(this->super_Bot).field_0x80;
  method = (peVar4->method).
           super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  peVar1 = (peVar4->body).
           super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_300,"",&local_311);
  }
  else {
    std::__cxx11::string::string((string *)&local_300,(string *)peVar1);
  }
  local_2a0._0_8_ = this;
  std::__shared_ptr<discordpp::BotStruct::RenderedCall,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<discordpp::BotStruct::RenderedCall,_(__gnu_cxx::_Lock_policy)2> *)
             (local_2a0 + 8),local_310);
  std::__cxx11::string::string(local_288,(string *)&local_2e0);
  std::
  function<void(std::shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>>>::Response>,std::error_code_const&)>
  ::
  function<discordpp::RestSimpleWeb<discordpp::Bot>::doCall(std::shared_ptr<discordpp::BotStruct::RenderedCall>)::_lambda(std::shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>>>::Response>,std::error_code_const&)_1_,void>
            ((function<void(std::shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>>>::Response>,std::error_code_const&)>
              *)&local_2c0,(anon_class_56_3_fbde57b0 *)local_2a0);
  content._M_str = local_300;
  content._M_len = local_2f8;
  SimpleWeb::
  ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::
  request(local_308,method,&local_2e0,content,(CaseInsensitiveMultimap *)&local_1e0,&local_2c0);
  std::_Function_base::~_Function_base(&local_2c0.super__Function_base);
  doCall(std::shared_ptr<discordpp::BotStruct::RenderedCall>)::
  {lambda(std::shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>>>::Response>,std::error_code_const&)#1}
  ::~error_code((_lambda_std__shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>>>::Response>_std__error_code_const___1_
                 *)local_2a0);
  std::__cxx11::string::~string((string *)&local_300);
  if ((local_310->_M_ptr->onWrite).
      super___shared_ptr<const_std::function<void_(bool)>,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    this_00 = *(io_context **)
               (&(this->super_Bot).field_0x80 + (long)(this->super_Bot)._vptr_Bot[-3]);
    std::__shared_ptr<discordpp::BotStruct::RenderedCall,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<discordpp::BotStruct::RenderedCall,_(__gnu_cxx::_Lock_policy)2> *)
               local_2a0,local_310);
    asio::io_context::
    post<discordpp::RestSimpleWeb<discordpp::Bot>::doCall(std::shared_ptr<discordpp::BotStruct::RenderedCall>)::_lambda()_1_>
              (this_00,(anon_class_16_1_898a275c_for_handler_ *)local_2a0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2a0 + 8));
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_SimpleWeb::CaseInsensitiveEqual,_SimpleWeb::CaseInsensitiveHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
  ::~_Hashtable(&local_1e0);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return;
}

Assistant:

void doCall(sptr<RenderedCall> call) override {
        std::ostringstream targetss;
        targetss << "/api/v" << apiVersion << *call->target;
        auto target = targetss.str();
        SimpleWeb::CaseInsensitiveMultimap headers{{"authorization", token},{"X-RateLimit-Precision", "millisecond"}, {"User-Agent", user_agent_}};
        if (call->type) {
            headers.insert({"Content-Type", *call->type});
        }
        client_->request(
            *call->method, target, call->body ? *call->body : "",
            headers,
            [this, call,
             target](std::shared_ptr<HttpsClient::Response> response,
                     const SimpleWeb::error_code &ec) {
                if (ec) {
                    if (call->onRead)
                        aioc->post([call] { (*call->onRead)(true, {}); });
                    return fail(ec, "read", call);
                }

                json jres;
                {
                    std::ostringstream ss;
                    ss << response->content.rdbuf();
                    const std::string &body = ss.str();
                    log::log(log::trace, [body](std::ostream *log) {
                        *log << "Received: " << body << '\n';
                    });
                    if (!body.empty()) {
                        if (body.at(0) == '{' || body.at(0) == '[') {
                            jres = {{"body", json::parse(body)}};
                        } else {
                            std::cerr
                                << "Discord replied:\n"
                                << ss.str() << "\nTo the following target:\n"
                                << target << "\nWith the following payload:\n"
                                << *call->body << std::endl;
                        }
                    }
                }

                int status = std::stoi(response->status_code);
                jres["result"] = status;

                for (auto h :
                     {"X-RateLimit-Global", "X-RateLimit-Limit",
                      "X-RateLimit-Remaining", "X-RateLimit-Reset",
                      "X-RateLimit-Reset-After", "X-RateLimit-Bucket"}) {
                    auto it = response->header.find(h);
                    if (it != response->header.end()) {
                        jres["header"][h] = it->second;
                    }
                }

                if (jres.find("embed") != jres.end()) {
                    std::cout << "Discord API didn't like the following parts "
                                 "of your "
                                 "embed: ";
                    bool first = true;
                    for (const json &part : jres["embed"]) {
                        if (first) {
                            first = false;
                        } else {
                            std::cout << ", ";
                        }
                        std::cout << part.get<std::string>();
                    }
                    std::cout << std::endl;
                }

                log::log(log::debug, [call, jres](std::ostream *log) {
                    *log << "Read " << call->target << jres.dump(4) << '\n';
                });

                if (status < 200 || status >= 300) {
                    log::log(log::error, [call, jres](std::ostream *log) {
                        *log << "Discord sent an error! " << call->target
                             << jres.dump(4) << '\n';
                    });
                }

                if (call->onRead) {
                    aioc->post([call, jres, status]() {
                        (*call->onRead)(status < 200 || status >= 300, jres);
                    });
                }
            });
        if (call->onWrite) {
            aioc->post([call]() {
                (*call->onWrite)(false);
            });
        }
    }